

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCaseHandle *testCase)

{
  uint64_t *puVar1;
  Totals *this_00;
  TestCaseInfo *pTVar2;
  IEventListener *pIVar3;
  IConfig *pIVar4;
  ulong uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  Totals *pTVar10;
  int iVar11;
  uint uVar12;
  SectionTracker *pSVar13;
  undefined4 extraout_var;
  long lVar14;
  string oneRunCerr;
  string oneRunCout;
  string redirectedCout;
  string redirectedCerr;
  TestCaseStats statsForOneRun;
  Totals beforeRunTotals;
  Totals prevTotals;
  Totals singleRunTotals;
  string local_220;
  string local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  undefined8 local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  undefined8 local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  NameAndLocationRef local_1a0;
  uint64_t uStack_180;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined1 local_118;
  TestCaseHandle **local_110;
  Totals *local_108;
  TrackerContext *local_100;
  Totals local_f8;
  Totals local_b8;
  Totals local_70;
  
  this_00 = &this->m_totals;
  local_b8.assertions.passed = (this->m_totals).assertions.passed;
  local_b8.assertions.failed = (this->m_totals).assertions.failed;
  local_b8.assertions.failedButOk = (this->m_totals).assertions.failedButOk;
  local_b8.assertions.skipped = (this->m_totals).assertions.skipped;
  local_b8.testCases.passed._0_4_ = (undefined4)(this->m_totals).testCases.passed;
  local_b8.testCases.passed._4_4_ = *(undefined4 *)((long)&(this->m_totals).testCases.passed + 4);
  local_b8.testCases.failed._0_4_ = (undefined4)(this->m_totals).testCases.failed;
  local_b8.testCases.failed._4_4_ = *(undefined4 *)((long)&(this->m_totals).testCases.failed + 4);
  local_b8.testCases.failedButOk._0_4_ = (undefined4)(this->m_totals).testCases.failedButOk;
  local_b8.testCases.failedButOk._4_4_ =
       *(undefined4 *)((long)&(this->m_totals).testCases.failedButOk + 4);
  local_b8.testCases.skipped._0_4_ = (undefined4)(this->m_totals).testCases.skipped;
  local_b8.testCases.skipped._4_4_ = *(undefined4 *)((long)&(this->m_totals).testCases.skipped + 4);
  pTVar2 = testCase->m_info;
  pIVar3 = (this->m_reporter).m_ptr;
  local_108 = __return_storage_ptr__;
  (*pIVar3->_vptr_IEventListener[5])(pIVar3,pTVar2);
  local_110 = &this->m_activeTestCase;
  this->m_activeTestCase = testCase;
  local_100 = &this->m_trackerContext;
  pSVar13 = (SectionTracker *)TestCaseTracking::TrackerContext::startRun(local_100);
  iVar11 = (*this->m_config->_vptr_IConfig[0x15])();
  TestCaseTracking::SectionTracker::addInitialFilters
            (pSVar13,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var,iVar11));
  pIVar4 = this->m_config;
  sharedRng();
  uVar12 = (*pIVar4->_vptr_IConfig[0x11])(pIVar4);
  sharedRng::s_rng.m_state = (ulong)uVar12 * 0x5851f42d4c957f2d + 0x6f1903917447ed96;
  local_1e0 = &local_1d0;
  local_1d8 = 0;
  local_1d0._M_local_buf[0] = '\0';
  local_1c0 = &local_1b0;
  local_1b8 = 0;
  local_1b0._M_local_buf[0] = '\0';
  lVar14 = 0;
  do {
    (this->m_trackerContext).m_currentTracker = (this->m_trackerContext).m_rootTracker.m_ptr;
    (this->m_trackerContext).m_runState = Executing;
    local_1a0.name.m_start = (pTVar2->name)._M_dataplus._M_p;
    local_1a0.name.m_size = (pTVar2->name)._M_string_length;
    local_1a0.location.file = (pTVar2->lineInfo).file;
    local_1a0.location.line = (pTVar2->lineInfo).line;
    pSVar13 = TestCaseTracking::SectionTracker::acquire(local_100,&local_1a0);
    this->m_testCaseTracker = (ITracker *)pSVar13;
    pIVar3 = (this->m_reporter).m_ptr;
    (*pIVar3->_vptr_IEventListener[6])(pIVar3,pTVar2,lVar14);
    local_f8.assertions.passed = (this_00->assertions).passed;
    local_f8.assertions.failed = (this->m_totals).assertions.failed;
    local_f8.assertions.failedButOk = (this->m_totals).assertions.failedButOk;
    local_f8.assertions.skipped = (this->m_totals).assertions.skipped;
    local_f8.testCases.passed = (this->m_totals).testCases.passed;
    local_f8.testCases.failed = (this->m_totals).testCases.failed;
    local_f8.testCases.failedButOk = (this->m_totals).testCases.failedButOk;
    local_f8.testCases.skipped = (this->m_totals).testCases.skipped;
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    local_200._M_string_length = 0;
    local_200.field_2._M_local_buf[0] = '\0';
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    local_220._M_string_length = 0;
    local_220.field_2._M_local_buf[0] = '\0';
    runCurrentTest(this,&local_200,&local_220);
    std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_200._M_dataplus._M_p);
    std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_220._M_dataplus._M_p);
    Totals::delta(&local_70,this_00,&local_f8);
    uVar5 = (this->m_totals).assertions.failed;
    iVar11 = (*this->m_config->_vptr_IConfig[9])();
    local_168 = (undefined4)local_70.testCases.failedButOk;
    uStack_164 = local_70.testCases.failedButOk._4_4_;
    uStack_160 = (undefined4)local_70.testCases.skipped;
    uStack_15c = local_70.testCases.skipped._4_4_;
    local_178 = (undefined4)local_70.testCases.passed;
    uStack_174 = local_70.testCases.passed._4_4_;
    uStack_170 = (undefined4)local_70.testCases.failed;
    uStack_16c = local_70.testCases.failed._4_4_;
    local_1a0.location.line = local_70.assertions.failedButOk;
    uStack_180 = local_70.assertions.skipped;
    local_1a0.name.m_size = local_70.assertions.passed;
    local_1a0.location.file = (char *)local_70.assertions.failed;
    local_158 = &local_148;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p == &local_200.field_2) {
      local_148._8_8_ = local_200.field_2._8_8_;
    }
    else {
      local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_200._M_dataplus._M_p;
    }
    local_148._M_allocated_capacity._1_7_ = local_200.field_2._M_allocated_capacity._1_7_;
    local_148._M_local_buf[0] = local_200.field_2._M_local_buf[0];
    local_150 = local_200._M_string_length;
    local_200._M_string_length = 0;
    local_200.field_2._M_local_buf[0] = '\0';
    local_138 = &local_128;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p == &local_220.field_2) {
      local_128._8_8_ = local_220.field_2._8_8_;
    }
    else {
      local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p;
    }
    local_128._M_allocated_capacity._1_7_ = local_220.field_2._M_allocated_capacity._1_7_;
    local_128._M_local_buf[0] = local_220.field_2._M_local_buf[0];
    local_118 = (ulong)(long)iVar11 <= uVar5;
    local_130 = local_220._M_string_length;
    local_220._M_string_length = 0;
    local_220.field_2._M_local_buf[0] = '\0';
    pIVar3 = (this->m_reporter).m_ptr;
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    local_1a0.name.m_start = (char *)pTVar2;
    (*pIVar3->_vptr_IEventListener[0xf])(pIVar3,&local_1a0,lVar14);
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128._M_allocated_capacity + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,
                      CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                               local_220.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,
                      CONCAT71(local_200.field_2._M_allocated_capacity._1_7_,
                               local_200.field_2._M_local_buf[0]) + 1);
    }
    if (this->m_testCaseTracker->m_runState == CompletedSuccessfully) break;
    uVar5 = (this->m_totals).assertions.failed;
    iVar11 = (*this->m_config->_vptr_IConfig[9])();
    lVar14 = lVar14 + 1;
  } while (uVar5 < (ulong)(long)iVar11);
  pTVar10 = local_108;
  Totals::delta(local_108,this_00,&local_b8);
  uVar6 = (pTVar10->testCases).passed;
  if ((uVar6 != 0 & pTVar2->properties >> 2) == 1) {
    puVar1 = &(pTVar10->assertions).failed;
    *puVar1 = *puVar1 + 1;
    (pTVar10->testCases).passed = uVar6 - 1;
    puVar1 = &(pTVar10->testCases).failed;
    *puVar1 = *puVar1 + 1;
  }
  uVar6 = (pTVar10->testCases).failed;
  uVar7 = (this->m_totals).testCases.failed;
  uVar8 = (this->m_totals).testCases.failedButOk;
  uVar9 = (this->m_totals).testCases.skipped;
  (this->m_totals).testCases.passed =
       (this->m_totals).testCases.passed + (pTVar10->testCases).passed;
  (this->m_totals).testCases.failed = uVar7 + uVar6;
  uVar6 = (pTVar10->testCases).skipped;
  (this->m_totals).testCases.failedButOk = (pTVar10->testCases).failedButOk + uVar8;
  (this->m_totals).testCases.skipped = uVar6 + uVar9;
  pIVar3 = (this->m_reporter).m_ptr;
  uVar5 = (this->m_totals).assertions.failed;
  iVar11 = (*this->m_config->_vptr_IConfig[9])();
  local_1a0.name.m_size = (pTVar10->assertions).passed;
  local_1a0.location.file = (char *)(pTVar10->assertions).failed;
  local_1a0.location.line = (pTVar10->assertions).failedButOk;
  uStack_180 = (pTVar10->assertions).skipped;
  local_178 = (undefined4)(pTVar10->testCases).passed;
  uStack_174 = *(undefined4 *)((long)&(pTVar10->testCases).passed + 4);
  uStack_170 = (undefined4)(pTVar10->testCases).failed;
  uStack_16c = *(undefined4 *)((long)&(pTVar10->testCases).failed + 4);
  local_168 = (undefined4)(pTVar10->testCases).failedButOk;
  uStack_164 = *(undefined4 *)((long)&(pTVar10->testCases).failedButOk + 4);
  uStack_160 = (undefined4)(pTVar10->testCases).skipped;
  uStack_15c = *(undefined4 *)((long)&(pTVar10->testCases).skipped + 4);
  local_158 = &local_148;
  if (local_1e0 == &local_1d0) {
    local_148._8_8_ = local_1d0._8_8_;
  }
  else {
    local_158 = local_1e0;
  }
  local_148._M_allocated_capacity._1_7_ = local_1d0._M_allocated_capacity._1_7_;
  local_148._M_local_buf[0] = local_1d0._M_local_buf[0];
  local_150 = local_1d8;
  local_1d8 = 0;
  local_1d0._M_local_buf[0] = '\0';
  local_138 = &local_128;
  if (local_1c0 == &local_1b0) {
    local_128._8_8_ = local_1b0._8_8_;
  }
  else {
    local_138 = local_1c0;
  }
  local_128._M_allocated_capacity._1_7_ = local_1b0._M_allocated_capacity._1_7_;
  local_128._M_local_buf[0] = local_1b0._M_local_buf[0];
  local_118 = (ulong)(long)iVar11 <= uVar5;
  local_130 = local_1b8;
  local_1b8 = 0;
  local_1b0._M_local_buf[0] = '\0';
  local_1e0 = &local_1d0;
  local_1c0 = &local_1b0;
  local_1a0.name.m_start = (char *)pTVar2;
  (*pIVar3->_vptr_IEventListener[0x10])(pIVar3);
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148._M_allocated_capacity + 1);
  }
  local_110[0] = (TestCaseHandle *)0x0;
  local_110[1] = (TestCaseHandle *)0x0;
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,
                    CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,
                    CONCAT71(local_1d0._M_allocated_capacity._1_7_,local_1d0._M_local_buf[0]) + 1);
  }
  return pTVar10;
}

Assistant:

Totals RunContext::runTest(TestCaseHandle const& testCase) {
        const Totals prevTotals = m_totals;

        auto const& testInfo = testCase.getTestCaseInfo();
        m_reporter->testCaseStarting(testInfo);
        m_activeTestCase = &testCase;


        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());

        // We intentionally only seed the internal RNG once per test case,
        // before it is first invoked. The reason for that is a complex
        // interplay of generator/section implementation details and the
        // Random*Generator types.
        //
        // The issue boils down to us needing to seed the Random*Generators
        // with different seed each, so that they return different sequences
        // of random numbers. We do this by giving them a number from the
        // shared RNG instance as their seed.
        //
        // However, this runs into an issue if the reseeding happens each
        // time the test case is entered (as opposed to first time only),
        // because multiple generators could get the same seed, e.g. in
        // ```cpp
        // TEST_CASE() {
        //     auto i = GENERATE(take(10, random(0, 100));
        //     SECTION("A") {
        //         auto j = GENERATE(take(10, random(0, 100));
        //     }
        //     SECTION("B") {
        //         auto k = GENERATE(take(10, random(0, 100));
        //     }
        // }
        // ```
        // `i` and `j` would properly return values from different sequences,
        // but `i` and `k` would return the same sequence, because their seed
        // would be the same.
        // (The reason their seeds would be the same is that the generator
        //  for k would be initialized when the test case is entered the second
        //  time, after the shared RNG instance was reset to the same value
        //  it had when the generator for i was initialized.)
        seedRng( *m_config );

        uint64_t testRuns = 0;
        std::string redirectedCout;
        std::string redirectedCerr;
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocationRef(testInfo.name, testInfo.lineInfo));

            m_reporter->testCasePartialStarting(testInfo, testRuns);

            const auto beforeRunTotals = m_totals;
            std::string oneRunCout, oneRunCerr;
            runCurrentTest(oneRunCout, oneRunCerr);
            redirectedCout += oneRunCout;
            redirectedCerr += oneRunCerr;

            const auto singleRunTotals = m_totals.delta(beforeRunTotals);
            auto statsForOneRun = TestCaseStats(testInfo, singleRunTotals, CATCH_MOVE(oneRunCout), CATCH_MOVE(oneRunCerr), aborting());

            m_reporter->testCasePartialEnded(statsForOneRun, testRuns);
            ++testRuns;
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  CATCH_MOVE(redirectedCout),
                                  CATCH_MOVE(redirectedCerr),
                                  aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }